

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcpndrv.h
# Opt level: O0

CTcPrsNode * __thiscall CTPNStmForBase::adjust_for_dyn(CTPNStmForBase *this,tcpn_dyncomp_info *info)

{
  _func_int **pp_Var1;
  undefined8 in_RSI;
  CTcPrsNode *in_RDI;
  
  if (in_RDI[5].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase != (_func_int **)0x0) {
    pp_Var1 = in_RDI[5].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase;
    pp_Var1 = (_func_int **)(**(code **)(*pp_Var1 + 0x88))(pp_Var1,in_RSI);
    in_RDI[5].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = pp_Var1;
  }
  if (in_RDI[6].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase != (_func_int **)0x0) {
    pp_Var1 = in_RDI[6].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase;
    pp_Var1 = (_func_int **)(**(code **)(*pp_Var1 + 0x88))(pp_Var1,in_RSI);
    in_RDI[6].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = pp_Var1;
  }
  if (in_RDI[7].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase != (_func_int **)0x0) {
    pp_Var1 = in_RDI[7].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase;
    pp_Var1 = (_func_int **)(**(code **)(*pp_Var1 + 0x88))(pp_Var1,in_RSI);
    in_RDI[7].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = pp_Var1;
  }
  if (in_RDI[9].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase != (_func_int **)0x0) {
    pp_Var1 = in_RDI[9].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase;
    pp_Var1 = (_func_int **)(**(code **)(*pp_Var1 + 0x88))(pp_Var1,in_RSI);
    in_RDI[9].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = pp_Var1;
  }
  return in_RDI;
}

Assistant:

class CTcPrsNode *adjust_for_dyn(const tcpn_dyncomp_info *info)
    {
        if (init_expr_ != 0)
            init_expr_ = init_expr_->adjust_for_dyn(info);
        if (cond_expr_ != 0)
            cond_expr_ = cond_expr_->adjust_for_dyn(info);
        if (reinit_expr_ != 0)
            reinit_expr_ = reinit_expr_->adjust_for_dyn(info);
        if (body_stm_ != 0)
            body_stm_ = (CTPNStm *)body_stm_->adjust_for_dyn(info);

        return this;
    }